

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

u32 calculate_min_match_len(u8 *data,size_t data_len,u32 max_search_depth)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  u32 uVar4;
  u8 used [256];
  
  memset(used,0,0x100);
  if (data_len < 0x200) {
    return 3;
  }
  sVar1 = 0x1000;
  if (data_len < 0x1000) {
    sVar1 = data_len;
  }
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    used[data[sVar3]] = '\x01';
  }
  uVar4 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar4 = uVar4 + used[lVar2];
  }
  uVar4 = choose_min_match_len(uVar4,max_search_depth);
  return uVar4;
}

Assistant:

static u32
calculate_min_match_len(const u8 *data, size_t data_len, u32 max_search_depth)
{
	u8 used[256] = { 0 };
	u32 num_used_literals = 0;
	size_t i;

	/*
	 * For very short inputs, the static Huffman code has a good chance of
	 * being best, in which case there is no reason to avoid short matches.
	 */
	if (data_len < 512)
		return DEFLATE_MIN_MATCH_LEN;

	/*
	 * For an initial approximation, scan the first 4 KiB of data.  The
	 * caller may use recalculate_min_match_len() to update min_len later.
	 */
	data_len = MIN(data_len, 4096);
	for (i = 0; i < data_len; i++)
		used[data[i]] = 1;
	for (i = 0; i < 256; i++)
		num_used_literals += used[i];
	return choose_min_match_len(num_used_literals, max_search_depth);
}